

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binaryop_x86_avx.cpp
# Opt level: O1

int __thiscall
ncnn::BinaryOp_x86_avx::forward
          (BinaryOp_x86_avx *this,vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *bottom_blobs,
          vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *top_blobs,Option *opt)

{
  int iVar1;
  int iVar2;
  int iVar3;
  Mat *pMVar4;
  bool bVar5;
  undefined1 auVar6 [32];
  Mat *m;
  Mat *pMVar7;
  uint uVar8;
  float *pfVar9;
  int iVar10;
  undefined1 (*pauVar11) [32];
  Option *opt_00;
  undefined1 (*pauVar12) [32];
  int iVar13;
  long lVar14;
  uint uVar15;
  uint uVar16;
  long lVar17;
  float *pfVar18;
  float fVar19;
  float fVar20;
  float fVar22;
  float fVar23;
  undefined8 uVar24;
  undefined8 uVar25;
  undefined1 auVar21 [16];
  undefined8 uVar26;
  undefined8 uVar27;
  undefined1 auVar28 [16];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar35 [16];
  undefined1 in_ZMM2 [64];
  undefined1 auVar41 [64];
  float in_register_000012dc;
  float fVar42;
  float fVar43;
  float fVar44;
  float fVar45;
  float fVar46;
  float fVar47;
  float fVar48;
  float in_register_0000131c;
  undefined1 auVar49 [16];
  __m128 afVar50;
  binary_op_ratan2 op;
  __m128 _b;
  __m256 _b_avx;
  binary_op_ratan2 local_135;
  int local_134;
  long local_130;
  long local_128;
  float local_120 [2];
  float afStack_118 [2];
  Mat *local_110;
  Mat *local_108;
  float local_100 [2];
  float afStack_f8 [2];
  float afStack_f0 [2];
  float afStack_e8 [6];
  undefined1 local_d0 [16];
  undefined1 local_c0 [16];
  float afStack_b0 [2];
  float afStack_a8 [2];
  undefined1 local_a0 [32];
  float local_80 [2];
  float afStack_78 [2];
  float afStack_70 [2];
  float afStack_68 [14];
  
  pMVar4 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
           super__Vector_impl_data._M_start;
  pMVar7 = pMVar4 + 1;
  iVar10 = pMVar4[1].h * pMVar4[1].w * pMVar4[1].d * pMVar4[1].c * pMVar4[1].elempack;
  if ((pMVar4[1].dims <= pMVar4->dims) || (bVar5 = true, iVar10 == 1)) {
    bVar5 = pMVar4->c * pMVar4->elempack * pMVar4->d * pMVar4->h * pMVar4->w < iVar10;
  }
  uVar16 = *(uint *)(&this->field_0xd0 + (long)this->_vptr_BinaryOp_x86_avx[-3]);
  m = pMVar4;
  if (((bVar5) && (uVar8 = uVar16 - 1, m = pMVar7, pMVar7 = pMVar4, uVar8 < 0xb)) &&
     ((0x7e5U >> (uVar8 & 0x1f) & 1) != 0)) {
    uVar16 = *(uint *)(&DAT_0059fbb8 + (ulong)uVar8 * 4);
  }
  pMVar4 = (top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
           super__Vector_impl_data._M_start;
  Mat::create_like(pMVar4,m,opt->blob_allocator);
  if (pMVar4->data == (void *)0x0) {
    return -100;
  }
  if ((long)pMVar4->c * pMVar4->cstep == 0) {
    return -100;
  }
  iVar10 = pMVar7->c;
  iVar13 = pMVar7->d;
  iVar1 = pMVar7->elempack;
  iVar2 = pMVar7->w;
  iVar3 = pMVar7->h;
  if (iVar13 * iVar10 * iVar3 * iVar2 * iVar1 == 1) {
    if (0xb < uVar16) {
      return 0;
    }
    fVar20 = *pMVar7->data;
    local_d0 = ZEXT416((uint)fVar20);
    auVar21 = ZEXT416((uint)fVar20);
    auVar49 = ZEXT416((uint)fVar20);
    local_110 = pMVar4;
    local_108 = m;
    switch(uVar16) {
    case 0:
      iVar10 = m->c;
      if (0 < (long)iVar10) {
        uVar16 = m->h * m->w * m->d * m->elempack;
        auVar49 = vshufps_avx(auVar49,auVar21,0);
        lVar17 = 0;
        do {
          pfVar9 = (float *)(m->cstep * lVar17 * m->elemsize + (long)m->data);
          pauVar11 = (undefined1 (*) [32])
                     (pMVar4->cstep * lVar17 * pMVar4->elemsize + (long)pMVar4->data);
          fVar19 = auVar49._0_4_;
          fVar22 = auVar49._4_4_;
          fVar23 = auVar49._8_4_;
          fVar42 = auVar49._12_4_;
          if ((int)uVar16 < 8) {
            uVar8 = 0;
          }
          else {
            iVar13 = 7;
            do {
              auVar39._0_4_ = fVar19 + *pfVar9;
              auVar39._4_4_ = fVar22 + pfVar9[1];
              auVar39._8_4_ = fVar23 + pfVar9[2];
              auVar39._12_4_ = fVar42 + pfVar9[3];
              auVar39._16_4_ = fVar19 + pfVar9[4];
              auVar39._20_4_ = fVar22 + pfVar9[5];
              auVar39._24_4_ = fVar23 + pfVar9[6];
              auVar39._28_4_ = fVar42 + pfVar9[7];
              *pauVar11 = auVar39;
              pfVar9 = pfVar9 + 8;
              pauVar11 = pauVar11 + 1;
              iVar13 = iVar13 + 8;
              uVar8 = uVar16 & 0xfffffff8;
            } while (iVar13 < (int)uVar16);
          }
          uVar15 = uVar8 | 3;
          while ((int)uVar15 < (int)uVar16) {
            auVar34._0_4_ = fVar19 + *pfVar9;
            auVar34._4_4_ = fVar22 + pfVar9[1];
            auVar34._8_4_ = fVar23 + pfVar9[2];
            auVar34._12_4_ = fVar42 + pfVar9[3];
            *(undefined1 (*) [16])*pauVar11 = auVar34;
            pfVar9 = pfVar9 + 4;
            pauVar11 = (undefined1 (*) [32])((long)*pauVar11 + 0x10);
            uVar15 = uVar8 + 7;
            uVar8 = uVar8 + 4;
          }
          if (uVar16 - uVar8 != 0 && (int)uVar8 <= (int)uVar16) {
            lVar14 = 0;
            do {
              *(float *)((long)*pauVar11 + lVar14 * 4) = fVar20 + pfVar9[lVar14];
              lVar14 = lVar14 + 1;
            } while (uVar16 - uVar8 != (int)lVar14);
          }
          lVar17 = lVar17 + 1;
        } while (lVar17 != iVar10);
      }
      break;
    case 1:
      iVar10 = m->c;
      if (0 < (long)iVar10) {
        uVar16 = m->h * m->w * m->d * m->elempack;
        auVar49 = vshufps_avx(auVar21,auVar49,0);
        auVar31._16_16_ = auVar49;
        auVar31._0_16_ = auVar49;
        lVar17 = 0;
        do {
          pauVar11 = (undefined1 (*) [32])(m->cstep * lVar17 * m->elemsize + (long)m->data);
          pauVar12 = (undefined1 (*) [32])
                     (pMVar4->cstep * lVar17 * pMVar4->elemsize + (long)pMVar4->data);
          if ((int)uVar16 < 8) {
            uVar8 = 0;
          }
          else {
            iVar13 = 7;
            do {
              auVar33 = vsubps_avx(*pauVar11,auVar31);
              *pauVar12 = auVar33;
              pauVar11 = pauVar11 + 1;
              pauVar12 = pauVar12 + 1;
              iVar13 = iVar13 + 8;
              uVar8 = uVar16 & 0xfffffff8;
            } while (iVar13 < (int)uVar16);
          }
          uVar15 = uVar8 | 3;
          while ((int)uVar15 < (int)uVar16) {
            auVar21 = vsubps_avx(*(undefined1 (*) [16])*pauVar11,auVar49);
            *(undefined1 (*) [16])*pauVar12 = auVar21;
            pauVar11 = (undefined1 (*) [32])(*pauVar11 + 0x10);
            pauVar12 = (undefined1 (*) [32])((long)*pauVar12 + 0x10);
            uVar15 = uVar8 + 7;
            uVar8 = uVar8 + 4;
          }
          if (uVar16 - uVar8 != 0 && (int)uVar8 <= (int)uVar16) {
            lVar14 = 0;
            do {
              *(float *)((long)*pauVar12 + lVar14 * 4) = *(float *)(*pauVar11 + lVar14 * 4) - fVar20
              ;
              lVar14 = lVar14 + 1;
            } while (uVar16 - uVar8 != (int)lVar14);
          }
          lVar17 = lVar17 + 1;
        } while (lVar17 != iVar10);
      }
      break;
    case 2:
      iVar10 = m->c;
      if (0 < (long)iVar10) {
        uVar16 = m->h * m->w * m->d * m->elempack;
        auVar49 = vshufps_avx(auVar21,auVar21,0);
        lVar17 = 0;
        do {
          pfVar9 = (float *)(m->cstep * lVar17 * m->elemsize + (long)m->data);
          pauVar11 = (undefined1 (*) [32])
                     (pMVar4->cstep * lVar17 * pMVar4->elemsize + (long)pMVar4->data);
          fVar19 = auVar49._0_4_;
          fVar22 = auVar49._4_4_;
          fVar23 = auVar49._8_4_;
          if ((int)uVar16 < 8) {
            uVar8 = 0;
          }
          else {
            iVar13 = 7;
            do {
              auVar41._0_4_ = fVar19 * *pfVar9;
              auVar41._4_4_ = fVar22 * pfVar9[1];
              auVar41._8_4_ = fVar23 * pfVar9[2];
              auVar41._12_4_ = auVar49._12_4_ * pfVar9[3];
              auVar41._16_4_ = fVar19 * pfVar9[4];
              auVar41._20_4_ = fVar22 * pfVar9[5];
              auVar41._28_36_ = in_ZMM2._28_36_;
              auVar41._24_4_ = fVar23 * pfVar9[6];
              in_ZMM2 = ZEXT3264(auVar41._0_32_);
              *pauVar11 = auVar41._0_32_;
              pfVar9 = pfVar9 + 8;
              pauVar11 = pauVar11 + 1;
              iVar13 = iVar13 + 8;
              uVar8 = uVar16 & 0xfffffff8;
            } while (iVar13 < (int)uVar16);
          }
          uVar15 = uVar8 | 3;
          while ((int)uVar15 < (int)uVar16) {
            auVar36._0_4_ = fVar19 * *pfVar9;
            auVar36._4_4_ = fVar22 * pfVar9[1];
            auVar36._8_4_ = fVar23 * pfVar9[2];
            auVar36._12_4_ = auVar49._12_4_ * pfVar9[3];
            in_ZMM2 = ZEXT1664(auVar36);
            *(undefined1 (*) [16])*pauVar11 = auVar36;
            pfVar9 = pfVar9 + 4;
            pauVar11 = (undefined1 (*) [32])((long)*pauVar11 + 0x10);
            uVar15 = uVar8 + 7;
            uVar8 = uVar8 + 4;
          }
          if (uVar16 - uVar8 != 0 && (int)uVar8 <= (int)uVar16) {
            lVar14 = 0;
            do {
              in_ZMM2 = ZEXT464((uint)(fVar20 * pfVar9[lVar14]));
              *(float *)((long)*pauVar11 + lVar14 * 4) = fVar20 * pfVar9[lVar14];
              lVar14 = lVar14 + 1;
            } while (uVar16 - uVar8 != (int)lVar14);
          }
          lVar17 = lVar17 + 1;
        } while (lVar17 != iVar10);
      }
      break;
    case 3:
      iVar10 = m->c;
      if (0 < (long)iVar10) {
        uVar16 = m->h * m->w * m->d * m->elempack;
        auVar21._0_4_ = 1.0 / fVar20;
        auVar21._4_12_ = SUB6012((undefined1  [60])0x0,0);
        auVar49 = vshufps_avx(auVar21,auVar21,0);
        lVar17 = 0;
        do {
          pfVar9 = (float *)(m->cstep * lVar17 * m->elemsize + (long)m->data);
          pfVar18 = (float *)(pMVar4->cstep * lVar17 * pMVar4->elemsize + (long)pMVar4->data);
          fVar20 = auVar49._0_4_;
          fVar19 = auVar49._4_4_;
          fVar22 = auVar49._8_4_;
          if ((int)uVar16 < 8) {
            uVar8 = 0;
          }
          else {
            iVar13 = 7;
            do {
              fVar23 = pfVar9[1];
              fVar42 = pfVar9[2];
              fVar43 = pfVar9[3];
              fVar44 = pfVar9[4];
              fVar45 = pfVar9[5];
              fVar46 = pfVar9[6];
              *pfVar18 = fVar20 * *pfVar9;
              pfVar18[1] = fVar19 * fVar23;
              pfVar18[2] = fVar22 * fVar42;
              pfVar18[3] = auVar49._12_4_ * fVar43;
              pfVar18[4] = fVar20 * fVar44;
              pfVar18[5] = fVar19 * fVar45;
              pfVar18[6] = fVar22 * fVar46;
              pfVar18[7] = in_register_000012dc;
              pfVar9 = pfVar9 + 8;
              pfVar18 = pfVar18 + 8;
              iVar13 = iVar13 + 8;
              uVar8 = uVar16 & 0xfffffff8;
            } while (iVar13 < (int)uVar16);
          }
          uVar15 = uVar8 | 3;
          while ((int)uVar15 < (int)uVar16) {
            fVar23 = pfVar9[1];
            fVar42 = pfVar9[2];
            fVar43 = pfVar9[3];
            in_register_000012dc = 0.0;
            *pfVar18 = fVar20 * *pfVar9;
            pfVar18[1] = fVar19 * fVar23;
            pfVar18[2] = fVar22 * fVar42;
            pfVar18[3] = auVar49._12_4_ * fVar43;
            pfVar9 = pfVar9 + 4;
            pfVar18 = pfVar18 + 4;
            uVar15 = uVar8 + 7;
            uVar8 = uVar8 + 4;
          }
          if (uVar16 - uVar8 != 0 && (int)uVar8 <= (int)uVar16) {
            lVar14 = 0;
            do {
              in_register_000012dc = 0.0;
              pfVar18[lVar14] = auVar21._0_4_ * pfVar9[lVar14];
              lVar14 = lVar14 + 1;
            } while (uVar16 - uVar8 != (int)lVar14);
          }
          lVar17 = lVar17 + 1;
        } while (lVar17 != iVar10);
      }
      break;
    case 4:
      iVar10 = m->c;
      if (0 < (long)iVar10) {
        uVar16 = m->h * m->w * m->d * m->elempack;
        auVar49 = vshufps_avx(auVar49,auVar49,0);
        auVar29._16_16_ = auVar49;
        auVar29._0_16_ = auVar49;
        lVar17 = 0;
        do {
          pauVar11 = (undefined1 (*) [32])(m->cstep * lVar17 * m->elemsize + (long)m->data);
          pauVar12 = (undefined1 (*) [32])
                     (pMVar4->cstep * lVar17 * pMVar4->elemsize + (long)pMVar4->data);
          if ((int)uVar16 < 8) {
            uVar8 = 0;
          }
          else {
            iVar13 = 7;
            do {
              auVar33 = vmaxps_avx(auVar29,*pauVar11);
              *pauVar12 = auVar33;
              pauVar11 = pauVar11 + 1;
              pauVar12 = pauVar12 + 1;
              iVar13 = iVar13 + 8;
              uVar8 = uVar16 & 0xfffffff8;
            } while (iVar13 < (int)uVar16);
          }
          uVar15 = uVar8 | 3;
          while ((int)uVar15 < (int)uVar16) {
            auVar35 = vmaxps_avx(auVar49,*(undefined1 (*) [16])*pauVar11);
            *(undefined1 (*) [16])*pauVar12 = auVar35;
            pauVar11 = (undefined1 (*) [32])(*pauVar11 + 0x10);
            pauVar12 = (undefined1 (*) [32])((long)*pauVar12 + 0x10);
            uVar15 = uVar8 + 7;
            uVar8 = uVar8 + 4;
          }
          if (uVar16 - uVar8 != 0 && (int)uVar8 <= (int)uVar16) {
            lVar14 = 0;
            do {
              auVar35 = vmaxss_avx(auVar21,ZEXT416(*(uint *)(*pauVar11 + lVar14 * 4)));
              *(int *)((long)*pauVar12 + lVar14 * 4) = auVar35._0_4_;
              lVar14 = lVar14 + 1;
            } while (uVar16 - uVar8 != (int)lVar14);
          }
          lVar17 = lVar17 + 1;
        } while (lVar17 != iVar10);
      }
      break;
    case 5:
      iVar10 = m->c;
      if (0 < (long)iVar10) {
        uVar16 = m->h * m->w * m->d * m->elempack;
        auVar21 = vshufps_avx(auVar21,auVar49,0);
        auVar32._16_16_ = auVar21;
        auVar32._0_16_ = auVar21;
        lVar17 = 0;
        do {
          pauVar11 = (undefined1 (*) [32])(m->cstep * lVar17 * m->elemsize + (long)m->data);
          pauVar12 = (undefined1 (*) [32])
                     (pMVar4->cstep * lVar17 * pMVar4->elemsize + (long)pMVar4->data);
          if ((int)uVar16 < 8) {
            uVar8 = 0;
          }
          else {
            iVar13 = 7;
            do {
              auVar33 = vminps_avx(auVar32,*pauVar11);
              *pauVar12 = auVar33;
              pauVar11 = pauVar11 + 1;
              pauVar12 = pauVar12 + 1;
              iVar13 = iVar13 + 8;
              uVar8 = uVar16 & 0xfffffff8;
            } while (iVar13 < (int)uVar16);
          }
          uVar15 = uVar8 | 3;
          while ((int)uVar15 < (int)uVar16) {
            auVar35 = vminps_avx(auVar21,*(undefined1 (*) [16])*pauVar11);
            *(undefined1 (*) [16])*pauVar12 = auVar35;
            pauVar11 = (undefined1 (*) [32])(*pauVar11 + 0x10);
            pauVar12 = (undefined1 (*) [32])((long)*pauVar12 + 0x10);
            uVar15 = uVar8 + 7;
            uVar8 = uVar8 + 4;
          }
          if (uVar16 - uVar8 != 0 && (int)uVar8 <= (int)uVar16) {
            lVar14 = 0;
            do {
              auVar35 = vminss_avx(auVar49,ZEXT416(*(uint *)(*pauVar11 + lVar14 * 4)));
              *(int *)((long)*pauVar12 + lVar14 * 4) = auVar35._0_4_;
              lVar14 = lVar14 + 1;
            } while (uVar16 - uVar8 != (int)lVar14);
          }
          lVar17 = lVar17 + 1;
        } while (lVar17 != iVar10);
      }
      break;
    case 6:
      local_130 = (long)m->c;
      if (0 < local_130) {
        local_134 = m->h * m->w * m->d * m->elempack;
        auVar49 = vshufps_avx(auVar21,auVar21,0);
        local_a0 = ZEXT1632(auVar49);
        register0x00001210 = auVar49;
        local_c0 = auVar49;
        local_128 = 0;
        do {
          auVar33 = _local_c0;
          pfVar9 = (float *)(local_108->cstep * local_128 * local_108->elemsize +
                            (long)local_108->data);
          pfVar18 = (float *)(local_110->cstep * local_128 * local_110->elemsize +
                             (long)local_110->data);
          local_80[0] = (float)local_c0._0_4_;
          local_80[1] = (float)local_c0._4_4_;
          afStack_78[0] = (float)local_c0._8_4_;
          afStack_78[1] = (float)local_c0._12_4_;
          afStack_70[0] = afStack_b0[0];
          afStack_70[1] = afStack_b0[1];
          afStack_68[0] = afStack_a8[0];
          afStack_68[1] = afStack_a8[1];
          _local_c0 = auVar33;
          if (local_134 < 8) {
            uVar16 = 0;
          }
          else {
            uVar8 = 0;
            do {
              uVar25 = *(undefined8 *)pfVar9;
              uVar24 = *(undefined8 *)(pfVar9 + 2);
              uVar26 = *(undefined8 *)(pfVar9 + 4);
              uVar27 = *(undefined8 *)(pfVar9 + 6);
              local_100 = (float  [2])uVar25;
              afStack_f8 = (float  [2])uVar24;
              afStack_f0 = (float  [2])uVar26;
              afStack_e8._0_8_ = uVar27;
              BinaryOp_x86_avx_functor::binary_op_pow::func_pack8
                        ((binary_op_pow *)&local_135,(__m256 *)local_100,(__m256 *)local_80);
              *(undefined8 *)pfVar18 = uVar25;
              *(undefined8 *)(pfVar18 + 2) = uVar24;
              *(undefined8 *)(pfVar18 + 4) = uVar26;
              *(undefined8 *)(pfVar18 + 6) = uVar27;
              pfVar9 = pfVar9 + 8;
              pfVar18 = pfVar18 + 8;
              uVar16 = uVar8 + 8;
              iVar10 = uVar8 + 0xf;
              uVar8 = uVar16;
              afStack_f0 = (float  [2])uVar26;
              afStack_e8._0_8_ = uVar27;
            } while (iVar10 < local_134);
          }
          auVar33 = local_a0;
          local_100[0] = (float)local_a0._0_4_;
          local_100[1] = (float)local_a0._4_4_;
          afStack_f8[0] = (float)local_a0._8_4_;
          afStack_f8[1] = (float)local_a0._12_4_;
          uVar8 = uVar16;
          local_a0 = auVar33;
          if ((int)(uVar16 | 3) < local_134) {
            do {
              local_120 = *(float (*) [2])pfVar9;
              uVar25 = *(undefined8 *)(pfVar9 + 2);
              afStack_118 = (float  [2])uVar25;
              afVar50 = BinaryOp_x86_avx_functor::binary_op_pow::func_pack4
                                  ((binary_op_pow *)&local_135,(__m128 *)local_120,
                                   (__m128 *)local_100);
              local_120 = afVar50._0_8_;
              *(float (*) [2])pfVar18 = local_120;
              *(undefined8 *)(pfVar18 + 2) = uVar25;
              pfVar9 = pfVar9 + 4;
              pfVar18 = pfVar18 + 4;
              uVar16 = uVar8 + 4;
              iVar10 = uVar8 + 7;
              uVar8 = uVar16;
              afStack_118 = (float  [2])uVar25;
            } while (iVar10 < local_134);
          }
          iVar10 = local_134 - uVar16;
          if ((int)uVar16 < local_134) {
            lVar17 = 0;
            do {
              fVar20 = powf(pfVar9[lVar17],local_d0._0_4_);
              pfVar18[lVar17] = fVar20;
              lVar17 = lVar17 + 1;
            } while (iVar10 != (int)lVar17);
          }
          local_128 = local_128 + 1;
        } while (local_128 != local_130);
      }
      break;
    case 7:
      iVar10 = m->c;
      if (0 < (long)iVar10) {
        uVar16 = m->h * m->w * m->d * m->elempack;
        auVar49 = vshufps_avx(auVar21,auVar21,0);
        auVar30._16_16_ = auVar49;
        auVar30._0_16_ = auVar49;
        lVar17 = 0;
        do {
          pauVar11 = (undefined1 (*) [32])(m->cstep * lVar17 * m->elemsize + (long)m->data);
          pauVar12 = (undefined1 (*) [32])
                     (pMVar4->cstep * lVar17 * pMVar4->elemsize + (long)pMVar4->data);
          if ((int)uVar16 < 8) {
            uVar8 = 0;
          }
          else {
            iVar13 = 7;
            do {
              auVar33 = vsubps_avx(auVar30,*pauVar11);
              *pauVar12 = auVar33;
              pauVar11 = pauVar11 + 1;
              pauVar12 = pauVar12 + 1;
              iVar13 = iVar13 + 8;
              uVar8 = uVar16 & 0xfffffff8;
            } while (iVar13 < (int)uVar16);
          }
          uVar15 = uVar8 | 3;
          while ((int)uVar15 < (int)uVar16) {
            auVar21 = vsubps_avx(auVar49,*(undefined1 (*) [16])*pauVar11);
            *(undefined1 (*) [16])*pauVar12 = auVar21;
            pauVar11 = (undefined1 (*) [32])(*pauVar11 + 0x10);
            pauVar12 = (undefined1 (*) [32])((long)*pauVar12 + 0x10);
            uVar15 = uVar8 + 7;
            uVar8 = uVar8 + 4;
          }
          if (uVar16 - uVar8 != 0 && (int)uVar8 <= (int)uVar16) {
            lVar14 = 0;
            do {
              *(float *)((long)*pauVar12 + lVar14 * 4) = fVar20 - *(float *)(*pauVar11 + lVar14 * 4)
              ;
              lVar14 = lVar14 + 1;
            } while (uVar16 - uVar8 != (int)lVar14);
          }
          lVar17 = lVar17 + 1;
        } while (lVar17 != iVar10);
      }
      break;
    case 8:
      iVar10 = m->c;
      if (0 < (long)iVar10) {
        uVar16 = m->h * m->w * m->d * m->elempack;
        auVar49 = vshufps_avx(auVar21,auVar21,0);
        auVar33._16_16_ = auVar49;
        auVar33._0_16_ = auVar49;
        lVar17 = 0;
        do {
          pauVar11 = (undefined1 (*) [32])(m->cstep * lVar17 * m->elemsize + (long)m->data);
          pauVar12 = (undefined1 (*) [32])
                     (pMVar4->cstep * lVar17 * pMVar4->elemsize + (long)pMVar4->data);
          fVar19 = auVar49._0_4_;
          fVar22 = auVar49._4_4_;
          fVar23 = auVar49._8_4_;
          if ((int)uVar16 < 8) {
            uVar8 = 0;
          }
          else {
            iVar13 = 7;
            do {
              auVar30 = *pauVar11;
              auVar32 = vrcpps_avx(auVar30);
              fVar42 = fVar19 * auVar32._0_4_;
              fVar43 = fVar22 * auVar32._4_4_;
              fVar44 = fVar23 * auVar32._8_4_;
              fVar45 = auVar49._12_4_ * auVar32._12_4_;
              fVar46 = fVar19 * auVar32._16_4_;
              fVar47 = fVar22 * auVar32._20_4_;
              fVar48 = fVar23 * auVar32._24_4_;
              auVar6._4_4_ = auVar30._4_4_ * fVar43;
              auVar6._0_4_ = auVar30._0_4_ * fVar42;
              auVar6._8_4_ = auVar30._8_4_ * fVar44;
              auVar6._12_4_ = auVar30._12_4_ * fVar45;
              auVar6._16_4_ = auVar30._16_4_ * fVar46;
              auVar6._20_4_ = auVar30._20_4_ * fVar47;
              auVar6._24_4_ = auVar30._24_4_ * fVar48;
              auVar6._28_4_ = auVar30._28_4_;
              auVar30 = vsubps_avx(auVar33,auVar6);
              auVar40._0_4_ = fVar42 + auVar32._0_4_ * auVar30._0_4_;
              auVar40._4_4_ = fVar43 + auVar32._4_4_ * auVar30._4_4_;
              auVar40._8_4_ = fVar44 + auVar32._8_4_ * auVar30._8_4_;
              auVar40._12_4_ = fVar45 + auVar32._12_4_ * auVar30._12_4_;
              auVar40._16_4_ = fVar46 + auVar32._16_4_ * auVar30._16_4_;
              auVar40._20_4_ = fVar47 + auVar32._20_4_ * auVar30._20_4_;
              auVar40._24_4_ = fVar48 + auVar32._24_4_ * auVar30._24_4_;
              auVar40._28_4_ = in_register_0000131c + auVar30._28_4_;
              *pauVar12 = auVar40;
              pauVar11 = pauVar11 + 1;
              pauVar12 = pauVar12 + 1;
              iVar13 = iVar13 + 8;
              uVar8 = uVar16 & 0xfffffff8;
            } while (iVar13 < (int)uVar16);
          }
          uVar15 = uVar8 | 3;
          while ((int)uVar15 < (int)uVar16) {
            auVar21 = *(undefined1 (*) [16])*pauVar11;
            auVar35 = vrcpps_avx(auVar21);
            fVar42 = fVar19 * auVar35._0_4_;
            fVar43 = fVar22 * auVar35._4_4_;
            fVar44 = fVar23 * auVar35._8_4_;
            fVar45 = auVar49._12_4_ * auVar35._12_4_;
            in_register_0000131c = 0.0;
            auVar37._0_4_ = auVar21._0_4_ * fVar42;
            auVar37._4_4_ = auVar21._4_4_ * fVar43;
            auVar37._8_4_ = auVar21._8_4_ * fVar44;
            auVar37._12_4_ = auVar21._12_4_ * fVar45;
            auVar21 = vsubps_avx(auVar49,auVar37);
            auVar38._0_4_ = fVar42 + auVar35._0_4_ * auVar21._0_4_;
            auVar38._4_4_ = fVar43 + auVar35._4_4_ * auVar21._4_4_;
            auVar38._8_4_ = fVar44 + auVar35._8_4_ * auVar21._8_4_;
            auVar38._12_4_ = fVar45 + auVar35._12_4_ * auVar21._12_4_;
            *(undefined1 (*) [16])*pauVar12 = auVar38;
            pauVar11 = (undefined1 (*) [32])(*pauVar11 + 0x10);
            pauVar12 = (undefined1 (*) [32])((long)*pauVar12 + 0x10);
            uVar15 = uVar8 + 7;
            uVar8 = uVar8 + 4;
          }
          if (uVar16 - uVar8 != 0 && (int)uVar8 <= (int)uVar16) {
            lVar14 = 0;
            do {
              *(float *)((long)*pauVar12 + lVar14 * 4) = fVar20 / *(float *)(*pauVar11 + lVar14 * 4)
              ;
              lVar14 = lVar14 + 1;
            } while (uVar16 - uVar8 != (int)lVar14);
          }
          lVar17 = lVar17 + 1;
        } while (lVar17 != iVar10);
      }
      break;
    case 9:
      local_130 = (long)m->c;
      if (0 < local_130) {
        local_134 = m->h * m->w * m->d * m->elempack;
        auVar49 = vshufps_avx(auVar21,auVar21,0);
        local_a0 = ZEXT1632(auVar49);
        register0x00001210 = auVar49;
        local_c0 = auVar49;
        local_128 = 0;
        do {
          auVar33 = _local_c0;
          pfVar9 = (float *)(local_108->cstep * local_128 * local_108->elemsize +
                            (long)local_108->data);
          pfVar18 = (float *)(local_110->cstep * local_128 * local_110->elemsize +
                             (long)local_110->data);
          local_80[0] = (float)local_c0._0_4_;
          local_80[1] = (float)local_c0._4_4_;
          afStack_78[0] = (float)local_c0._8_4_;
          afStack_78[1] = (float)local_c0._12_4_;
          afStack_70[0] = afStack_b0[0];
          afStack_70[1] = afStack_b0[1];
          afStack_68[0] = afStack_a8[0];
          afStack_68[1] = afStack_a8[1];
          _local_c0 = auVar33;
          if (local_134 < 8) {
            uVar16 = 0;
          }
          else {
            uVar8 = 0;
            do {
              uVar25 = *(undefined8 *)pfVar9;
              uVar24 = *(undefined8 *)(pfVar9 + 2);
              uVar26 = *(undefined8 *)(pfVar9 + 4);
              uVar27 = *(undefined8 *)(pfVar9 + 6);
              local_100 = (float  [2])uVar25;
              afStack_f8 = (float  [2])uVar24;
              afStack_f0 = (float  [2])uVar26;
              afStack_e8._0_8_ = uVar27;
              BinaryOp_x86_avx_functor::binary_op_rpow::func_pack8
                        ((binary_op_rpow *)&local_135,(__m256 *)local_100,(__m256 *)local_80);
              *(undefined8 *)pfVar18 = uVar25;
              *(undefined8 *)(pfVar18 + 2) = uVar24;
              *(undefined8 *)(pfVar18 + 4) = uVar26;
              *(undefined8 *)(pfVar18 + 6) = uVar27;
              pfVar9 = pfVar9 + 8;
              pfVar18 = pfVar18 + 8;
              uVar16 = uVar8 + 8;
              iVar10 = uVar8 + 0xf;
              uVar8 = uVar16;
              afStack_f0 = (float  [2])uVar26;
              afStack_e8._0_8_ = uVar27;
            } while (iVar10 < local_134);
          }
          auVar33 = local_a0;
          local_100[0] = (float)local_a0._0_4_;
          local_100[1] = (float)local_a0._4_4_;
          afStack_f8[0] = (float)local_a0._8_4_;
          afStack_f8[1] = (float)local_a0._12_4_;
          uVar8 = uVar16;
          local_a0 = auVar33;
          if ((int)(uVar16 | 3) < local_134) {
            do {
              local_120 = *(float (*) [2])pfVar9;
              uVar25 = *(undefined8 *)(pfVar9 + 2);
              afStack_118 = (float  [2])uVar25;
              afVar50 = BinaryOp_x86_avx_functor::binary_op_rpow::func_pack4
                                  ((binary_op_rpow *)&local_135,(__m128 *)local_120,
                                   (__m128 *)local_100);
              local_120 = afVar50._0_8_;
              *(float (*) [2])pfVar18 = local_120;
              *(undefined8 *)(pfVar18 + 2) = uVar25;
              pfVar9 = pfVar9 + 4;
              pfVar18 = pfVar18 + 4;
              uVar16 = uVar8 + 4;
              iVar10 = uVar8 + 7;
              uVar8 = uVar16;
              afStack_118 = (float  [2])uVar25;
            } while (iVar10 < local_134);
          }
          iVar10 = local_134 - uVar16;
          if ((int)uVar16 < local_134) {
            lVar17 = 0;
            do {
              fVar20 = powf((float)local_d0._0_4_,pfVar9[lVar17]);
              pfVar18[lVar17] = fVar20;
              lVar17 = lVar17 + 1;
            } while (iVar10 != (int)lVar17);
          }
          local_128 = local_128 + 1;
        } while (local_128 != local_130);
      }
      break;
    case 10:
      local_130 = (long)m->c;
      if (0 < local_130) {
        local_134 = m->h * m->w * m->d * m->elempack;
        auVar49 = vshufps_avx(auVar21,auVar21,0);
        local_a0 = ZEXT1632(auVar49);
        register0x00001210 = auVar49;
        local_c0 = auVar49;
        local_128 = 0;
        do {
          auVar33 = _local_c0;
          pfVar9 = (float *)(local_108->cstep * local_128 * local_108->elemsize +
                            (long)local_108->data);
          pfVar18 = (float *)(local_110->cstep * local_128 * local_110->elemsize +
                             (long)local_110->data);
          local_80[0] = (float)local_c0._0_4_;
          local_80[1] = (float)local_c0._4_4_;
          afStack_78[0] = (float)local_c0._8_4_;
          afStack_78[1] = (float)local_c0._12_4_;
          afStack_70[0] = afStack_b0[0];
          afStack_70[1] = afStack_b0[1];
          afStack_68[0] = afStack_a8[0];
          afStack_68[1] = afStack_a8[1];
          _local_c0 = auVar33;
          if (local_134 < 8) {
            uVar16 = 0;
          }
          else {
            uVar8 = 0;
            do {
              uVar25 = *(undefined8 *)pfVar9;
              uVar24 = *(undefined8 *)(pfVar9 + 2);
              uVar26 = *(undefined8 *)(pfVar9 + 4);
              uVar27 = *(undefined8 *)(pfVar9 + 6);
              local_100 = (float  [2])uVar25;
              afStack_f8 = (float  [2])uVar24;
              afStack_f0 = (float  [2])uVar26;
              afStack_e8._0_8_ = uVar27;
              BinaryOp_x86_avx_functor::binary_op_atan2::func_pack8
                        ((binary_op_atan2 *)&local_135,(__m256 *)local_100,(__m256 *)local_80);
              *(undefined8 *)pfVar18 = uVar25;
              *(undefined8 *)(pfVar18 + 2) = uVar24;
              *(undefined8 *)(pfVar18 + 4) = uVar26;
              *(undefined8 *)(pfVar18 + 6) = uVar27;
              pfVar9 = pfVar9 + 8;
              pfVar18 = pfVar18 + 8;
              uVar16 = uVar8 + 8;
              iVar10 = uVar8 + 0xf;
              uVar8 = uVar16;
              afStack_f0 = (float  [2])uVar26;
              afStack_e8._0_8_ = uVar27;
            } while (iVar10 < local_134);
          }
          auVar33 = local_a0;
          local_100[0] = (float)local_a0._0_4_;
          local_100[1] = (float)local_a0._4_4_;
          afStack_f8[0] = (float)local_a0._8_4_;
          afStack_f8[1] = (float)local_a0._12_4_;
          uVar8 = uVar16;
          local_a0 = auVar33;
          if ((int)(uVar16 | 3) < local_134) {
            do {
              local_120 = *(float (*) [2])pfVar9;
              uVar25 = *(undefined8 *)(pfVar9 + 2);
              afStack_118 = (float  [2])uVar25;
              afVar50 = BinaryOp_x86_avx_functor::binary_op_atan2::func_pack4
                                  ((binary_op_atan2 *)&local_135,(__m128 *)local_120,
                                   (__m128 *)local_100);
              local_120 = afVar50._0_8_;
              *(float (*) [2])pfVar18 = local_120;
              *(undefined8 *)(pfVar18 + 2) = uVar25;
              pfVar9 = pfVar9 + 4;
              pfVar18 = pfVar18 + 4;
              uVar16 = uVar8 + 4;
              iVar10 = uVar8 + 7;
              uVar8 = uVar16;
              afStack_118 = (float  [2])uVar25;
            } while (iVar10 < local_134);
          }
          iVar10 = local_134 - uVar16;
          if ((int)uVar16 < local_134) {
            lVar17 = 0;
            do {
              fVar20 = atan2f(pfVar9[lVar17],local_d0._0_4_);
              pfVar18[lVar17] = fVar20;
              lVar17 = lVar17 + 1;
            } while (iVar10 != (int)lVar17);
          }
          local_128 = local_128 + 1;
        } while (local_128 != local_130);
      }
      break;
    case 0xb:
      local_130 = (long)m->c;
      if (0 < local_130) {
        local_134 = m->h * m->w * m->d * m->elempack;
        auVar49 = vshufps_avx(local_d0,auVar21,0);
        local_a0 = ZEXT1632(auVar49);
        register0x00001210 = auVar49;
        local_c0 = auVar49;
        local_128 = 0;
        do {
          auVar33 = _local_c0;
          pfVar9 = (float *)(local_108->cstep * local_128 * local_108->elemsize +
                            (long)local_108->data);
          pfVar18 = (float *)(local_110->cstep * local_128 * local_110->elemsize +
                             (long)local_110->data);
          local_80[0] = (float)local_c0._0_4_;
          local_80[1] = (float)local_c0._4_4_;
          afStack_78[0] = (float)local_c0._8_4_;
          afStack_78[1] = (float)local_c0._12_4_;
          afStack_70[0] = afStack_b0[0];
          afStack_70[1] = afStack_b0[1];
          afStack_68[0] = afStack_a8[0];
          afStack_68[1] = afStack_a8[1];
          _local_c0 = auVar33;
          if (local_134 < 8) {
            uVar16 = 0;
          }
          else {
            uVar8 = 0;
            do {
              uVar25 = *(undefined8 *)pfVar9;
              uVar24 = *(undefined8 *)(pfVar9 + 2);
              uVar26 = *(undefined8 *)(pfVar9 + 4);
              uVar27 = *(undefined8 *)(pfVar9 + 6);
              local_100 = (float  [2])uVar25;
              afStack_f8 = (float  [2])uVar24;
              afStack_f0 = (float  [2])uVar26;
              afStack_e8._0_8_ = uVar27;
              BinaryOp_x86_avx_functor::binary_op_ratan2::func_pack8
                        (&local_135,(__m256 *)local_100,(__m256 *)local_80);
              *(undefined8 *)pfVar18 = uVar25;
              *(undefined8 *)(pfVar18 + 2) = uVar24;
              *(undefined8 *)(pfVar18 + 4) = uVar26;
              *(undefined8 *)(pfVar18 + 6) = uVar27;
              pfVar9 = pfVar9 + 8;
              pfVar18 = pfVar18 + 8;
              uVar16 = uVar8 + 8;
              iVar10 = uVar8 + 0xf;
              uVar8 = uVar16;
              afStack_f0 = (float  [2])uVar26;
              afStack_e8._0_8_ = uVar27;
            } while (iVar10 < local_134);
          }
          auVar33 = local_a0;
          local_100[0] = (float)local_a0._0_4_;
          local_100[1] = (float)local_a0._4_4_;
          afStack_f8[0] = (float)local_a0._8_4_;
          afStack_f8[1] = (float)local_a0._12_4_;
          uVar8 = uVar16;
          local_a0 = auVar33;
          if ((int)(uVar16 | 3) < local_134) {
            do {
              local_120 = *(float (*) [2])pfVar9;
              uVar25 = *(undefined8 *)(pfVar9 + 2);
              afStack_118 = (float  [2])uVar25;
              afVar50 = BinaryOp_x86_avx_functor::binary_op_ratan2::func_pack4
                                  (&local_135,(__m128 *)local_120,(__m128 *)local_100);
              local_120 = afVar50._0_8_;
              *(float (*) [2])pfVar18 = local_120;
              *(undefined8 *)(pfVar18 + 2) = uVar25;
              pfVar9 = pfVar9 + 4;
              pfVar18 = pfVar18 + 4;
              uVar16 = uVar8 + 4;
              iVar10 = uVar8 + 7;
              uVar8 = uVar16;
              afStack_118 = (float  [2])uVar25;
            } while (iVar10 < local_134);
          }
          iVar10 = local_134 - uVar16;
          if ((int)uVar16 < local_134) {
            lVar17 = 0;
            do {
              fVar20 = atan2f((float)local_d0._0_4_,pfVar9[lVar17]);
              pfVar18[lVar17] = fVar20;
              lVar17 = lVar17 + 1;
            } while (iVar10 != (int)lVar17);
          }
          local_128 = local_128 + 1;
        } while (local_128 != local_130);
      }
    }
  }
  else {
    auVar49._0_4_ = pMVar7->w;
    auVar49._4_4_ = pMVar7->h;
    auVar49._8_4_ = pMVar7->d;
    auVar49._12_4_ = pMVar7->c;
    uVar8 = m->dims;
    uVar15 = pMVar7->dims;
    opt_00 = (Option *)(ulong)uVar15;
    if ((((uVar8 == uVar15) && (m->w == iVar2)) &&
        ((m->h == iVar3 && ((m->d == iVar13 && (m->c == iVar10)))))) && (m->elempack == iVar1)) {
      binary_op_no_broadcast(m,pMVar7,pMVar4,uVar16,opt_00);
    }
    else {
      if ((((((int)uVar8 <= (int)uVar15) && (((iVar2 != 1 || (uVar8 != 2)) || (iVar3 != m->h)))) &&
           (((auVar49._0_8_ != 0x100000001 || (uVar8 != 3)) || (iVar10 != m->c)))) &&
          (((iVar2 != 1 || (uVar8 != 3)) || ((iVar3 != m->h || (iVar10 != m->c)))))) &&
         ((auVar21 = vpinsrd_avx(auVar49,uVar8,3), auVar21 != _DAT_0059f8f0 || (iVar10 != m->c)))) {
        auVar35._8_4_ = 4;
        auVar35._0_8_ = 0x400000004;
        auVar35._12_4_ = 4;
        auVar21 = vpcmpeqd_avx(auVar21,auVar35);
        if (((auVar49._0_8_ != 0x100000001) ||
            ((((auVar21 & (undefined1  [16])0x100000000) == (undefined1  [16])0x0 ||
              (iVar13 != m->d)) || (iVar10 != m->c)))) &&
           ((((~auVar21[4] & 1) != 0 || iVar2 != 1 || (iVar3 != m->h)) ||
            ((iVar13 != m->d || (iVar10 != m->c)))))) {
          if ((iVar1 == 1) &&
             (((((uVar8 == 2 && (iVar3 == 1)) && (iVar2 == m->w)) ||
               ((uVar8 == 3 &&
                ((((iVar10 == 1 && (iVar3 == 1)) && (iVar2 == m->w)) ||
                 (((iVar2 == m->w && (iVar10 == 1)) && (iVar3 == m->h)))))))) ||
              (((auVar21 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0 &&
               ((auVar28._8_4_ = 1, auVar28._0_8_ = 0x100000001, auVar28._12_4_ = 1,
                auVar35 = vpinsrd_avx(auVar28,m->w,0), auVar49 == auVar35 ||
                (((auVar21 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0 &&
                 ((((iVar2 == m->w && (iVar10 == 1)) && ((iVar13 == 1 && (iVar3 == m->h)))) ||
                  (((((auVar21 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0 &&
                     (iVar2 == m->w)) && (iVar3 == m->h)) && ((iVar10 == 1 && (iVar13 == m->d)))))))
                 ))))))))) {
            binary_op_broadcast_outer(m,pMVar7,pMVar4,uVar16,opt_00);
            return 0;
          }
          uVar8 = uVar15 ^ 3 | uVar8 ^ 3;
          if (uVar8 != 0) {
            return 0;
          }
          if (iVar3 == 1) {
            if (m->w != iVar2) {
              return 0;
            }
            if (m->c != iVar10) {
              return 0;
            }
            binary_op_broadcast_20(m,pMVar7,pMVar4,uVar16,(Option *)(ulong)uVar8);
            return 0;
          }
          return 0;
        }
      }
      binary_op_broadcast_inner(m,pMVar7,pMVar4,uVar16,opt_00);
    }
  }
  return 0;
}

Assistant:

int BinaryOp_x86_avx::forward(const std::vector<Mat>& bottom_blobs, std::vector<Mat>& top_blobs, const Option& opt) const
{
    const bool b_is_scalar = bottom_blobs[1].w * bottom_blobs[1].h * bottom_blobs[1].d * bottom_blobs[1].c * bottom_blobs[1].elempack == 1;
    const bool a_rank_is_lower = bottom_blobs[0].dims < bottom_blobs[1].dims && !b_is_scalar;
    const bool a_size_is_lower = bottom_blobs[0].w * bottom_blobs[0].h * bottom_blobs[0].d * bottom_blobs[0].c * bottom_blobs[0].elempack < bottom_blobs[1].w * bottom_blobs[1].h * bottom_blobs[1].d * bottom_blobs[1].c * bottom_blobs[1].elempack;
    const bool a_is_lower = a_rank_is_lower || (!a_rank_is_lower && a_size_is_lower);
    const Mat& A = a_is_lower ? bottom_blobs[1] : bottom_blobs[0];
    const Mat& B = a_is_lower ? bottom_blobs[0] : bottom_blobs[1];
    const int op_type_r = a_is_lower ? get_reverse_op_type(op_type) : op_type;

    Mat& top_blob = top_blobs[0];
    top_blob.create_like(A, opt.blob_allocator);
    if (top_blob.empty())
        return -100;

    // B is a scalar
    if (B.w * B.h * B.d * B.c * B.elempack == 1)
    {
        return binary_op_scalar(A, B[0], top_blob, op_type_r, opt);
    }

    // no broadcast
    if (A.dims == B.dims && A.w == B.w && A.h == B.h && A.d == B.d && A.c == B.c && A.elempack == B.elempack)
    {
        return binary_op_no_broadcast(A, B, top_blob, op_type_r, opt);
    }

    // broadcast B for inner axis
    if ((B.dims < A.dims)
            || (A.dims == 2 && B.w == 1 && B.h == A.h)
            || (A.dims == 3 && B.w == 1 && B.h == 1 && B.c == A.c)
            || (A.dims == 3 && B.w == 1 && B.h == A.h && B.c == A.c)
            || (A.dims == 4 && B.w == 1 && B.h == 1 && B.d == 1 && B.c == A.c)
            || (A.dims == 4 && B.w == 1 && B.h == 1 && B.d == A.d && B.c == A.c)
            || (A.dims == 4 && B.w == 1 && B.h == A.h && B.d == A.d && B.c == A.c))
    {
        return binary_op_broadcast_inner(A, B, top_blob, op_type_r, opt);
    }

    // broadcast B for outer axis
    if (B.elempack == 1 && ((A.dims == 2 && B.w == A.w && B.h == 1) || (A.dims == 3 && B.w == A.w && B.h == 1 && B.c == 1) || (A.dims == 3 && B.w == A.w && B.h == A.h && B.c == 1) || (A.dims == 4 && B.w == A.w && B.h == 1 && B.d == 1 && B.c == 1) || (A.dims == 4 && B.w == A.w && B.h == A.h && B.d == 1 && B.c == 1) || (A.dims == 4 && B.w == A.w && B.h == A.h && B.d == A.d && B.c == 1)))
    {
        return binary_op_broadcast_outer(A, B, top_blob, op_type_r, opt);
    }

    // some special broadcast rule here
    if (A.dims == 3 && B.dims == 3 && A.w == B.w && B.h == 1 && A.c == B.c)
    {
        return binary_op_broadcast_20(A, B, top_blob, op_type_r, opt);
    }

    return 0;
}